

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

void __thiscall IRBuilder::IRBuilder(IRBuilder *this,Func *func)

{
  JitArenaAllocator *this_00;
  JITTimeFunctionBody *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_02;
  Opnd **ppOVar1;
  TrackAllocData local_48;
  uint local_1c;
  Func *pFStack_18;
  uint loopCount;
  Func *func_local;
  IRBuilder *this_local;
  
  this->seenLdStackArgPtr = false;
  this->expectApplyArg = false;
  this->seenProfiledBeginSwitch = false;
  this->m_func = func;
  pFStack_18 = func;
  func_local = (Func *)this;
  Js::
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::StatementReader(&this->m_statementReader);
  this->handlerOffsetStack =
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  IRBuilderSwitchAdapter::IRBuilderSwitchAdapter(&this->m_switchAdapter,this);
  SwitchIRBuilder::SwitchIRBuilder
            (&this->m_switchBuilder,&(this->m_switchAdapter).super_SwitchAdapter);
  this->m_ldSlots = (BVFixed *)0x0;
  this->m_usedAsTemp = (BVFixed *)0x0;
  this->m_loopBodyRetIPSym = (StackSym *)0x0;
  this->m_loopCounterSym = (StackSym *)0x0;
  this->m_stackFuncPtrSym = (StackSym *)0x0;
  this->m_paramScopeDone = false;
  this->callTreeHasSomeProfileInfo = false;
  this->finallyBlockLevel = 0;
  this->m_callsOnStack = 0;
  this->m_argsOnStack = 0;
  this->m_saveLoopImplicitCallFlags = (Opnd **)0x0;
  this->m_loopBodyForInEnumeratorArrayOpnd = (RegOpnd *)0x0;
  this->longBranchMap = (LongBranchMap *)0x0;
  GeneratorJumpTable::GeneratorJumpTable(&this->m_generatorJumpTable,pFStack_18,this);
  this_01 = Func::GetJITFunctionBody(pFStack_18);
  local_1c = JITTimeFunctionBody::GetLoopCount(this_01);
  if (local_1c != 0) {
    this_00 = pFStack_18->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&IR::Opnd*::typeinfo,0,(ulong)local_1c,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.h"
               ,0x5d);
    this_02 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_48);
    ppOVar1 = Memory::AllocateArray<Memory::ArenaAllocator,IR::Opnd*,false>
                        ((Memory *)this_02,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                         (ulong)local_1c);
    this->m_saveLoopImplicitCallFlags = ppOVar1;
  }
  JITTimeWorkItem::InitializeReader
            (pFStack_18->m_workItem,&this->m_jnReader,&this->m_statementReader,
             &pFStack_18->m_alloc->super_ArenaAllocator);
  return;
}

Assistant:

IRBuilder(Func * func)
        : m_func(func)
        , m_argsOnStack(0)
        , m_loopBodyRetIPSym(nullptr)
        , m_ldSlots(nullptr)
        , m_loopCounterSym(nullptr)
        , callTreeHasSomeProfileInfo(false)
        , finallyBlockLevel(0)
        , m_saveLoopImplicitCallFlags(nullptr)
        , handlerOffsetStack(nullptr)
        , m_switchAdapter(this)
        , m_switchBuilder(&m_switchAdapter)
        , m_stackFuncPtrSym(nullptr)
        , m_loopBodyForInEnumeratorArrayOpnd(nullptr)
        , m_paramScopeDone(false)
#if DBG
        , m_callsOnStack(0)
        , m_usedAsTemp(nullptr)
#endif
#ifdef BAILOUT_INJECTION
        , seenLdStackArgPtr(false)
        , expectApplyArg(false)
        , seenProfiledBeginSwitch(false)
#endif
#ifdef BYTECODE_BRANCH_ISLAND
        , longBranchMap(nullptr)
#endif
        , m_generatorJumpTable(GeneratorJumpTable(func, this))
    {
        auto loopCount = func->GetJITFunctionBody()->GetLoopCount();
        if (loopCount > 0) {
#if DBG
            m_saveLoopImplicitCallFlags = AnewArrayZ(func->m_alloc, IR::Opnd*, loopCount);
#else
            m_saveLoopImplicitCallFlags = AnewArray(func->m_alloc, IR::Opnd*, loopCount);
#endif
        }

        // Note: use original byte code without debugging probes, so that we don't jit BPs inserted by the user.
        func->m_workItem->InitializeReader(&m_jnReader, &m_statementReader, func->m_alloc);
    }